

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_mode_setting.cpp
# Opt level: O3

spv_result_t spvtools::val::ValidateFloatControls2(ValidationState_t *_)

{
  pointer puVar1;
  Instruction *pIVar2;
  long *plVar3;
  pointer ppVar4;
  Decoration DVar5;
  uint uVar6;
  FPFastMathModeMask FVar7;
  const_iterator cVar8;
  Instruction *pIVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar10;
  __hash_code __code;
  long lVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  pointer puVar15;
  char *pcVar16;
  uint *puVar17;
  spv_result_t sVar18;
  Instruction *inst;
  Instruction *this;
  pointer ppVar19;
  bool bVar20;
  pair<std::__detail::_Node_iterator<const_spvtools::val::Instruction_*,_true,_false>,_bool> pVar21;
  vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
  worklist;
  Instruction *inst_1;
  string dec;
  unordered_set<const_spvtools::val::Instruction_*,_std::hash<const_spvtools::val::Instruction_*>,_std::equal_to<const_spvtools::val::Instruction_*>,_std::allocator<const_spvtools::val::Instruction_*>_>
  visited;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  fp_fast_math_default_entry_points;
  pair<const_spvtools::val::Instruction_*,_spv::Decoration> *local_2b8;
  iterator iStack_2b0;
  pair<const_spvtools::val::Instruction_*,_spv::Decoration> *local_2a8;
  Instruction *local_2a0;
  long *local_298;
  long local_290;
  long local_288 [2];
  undefined1 local_278 [40];
  pointer local_250;
  __node_base_ptr p_Stack_248;
  undefined1 local_240 [32];
  float local_220;
  Function *local_218;
  BasicBlock *pBStack_210;
  DiagnosticStream local_208;
  
  local_240._0_8_ = &pBStack_210;
  local_240._8_8_ = (pointer)0x1;
  local_240._16_8_ = (spv_parsed_operand_t *)0x0;
  local_240._24_8_ = (pointer)0x0;
  local_220 = 1.0;
  local_218 = (Function *)0x0;
  pBStack_210 = (BasicBlock *)0x0;
  puVar15 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar1 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar15 != puVar1) {
    do {
      local_278._0_4_ = *puVar15;
      local_208._0_4_ = *puVar15;
      cVar8 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(_->entry_point_to_execution_modes_)._M_h,(key_type *)&local_208);
      if ((cVar8.
           super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
           ._M_cur != (__node_type *)0x0) &&
         (lVar11 = *(long *)((long)cVar8.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                   ._M_cur + 0x20), lVar11 != 0)) {
        lVar12 = (long)cVar8.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                       ._M_cur + 0x18;
        do {
          bVar20 = *(uint *)(lVar11 + 0x20) < 0x178c;
          if (!bVar20) {
            lVar12 = lVar11;
          }
          lVar11 = *(long *)(lVar11 + 0x10 + (ulong)bVar20 * 8);
        } while (lVar11 != 0);
        if ((lVar12 != (long)cVar8.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                             ._M_cur + 0x18) && (*(uint *)(lVar12 + 0x20) < 0x178d)) {
          local_208._0_8_ = (Instruction *)local_240;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_240,local_278,&local_208);
        }
      }
      puVar15 = puVar15 + 1;
    } while (puVar15 != puVar1);
  }
  local_2b8 = (pair<const_spvtools::val::Instruction_*,_spv::Decoration> *)0x0;
  iStack_2b0._M_current = (pair<const_spvtools::val::Instruction_*,_spv::Decoration> *)0x0;
  local_2a8 = (pair<const_spvtools::val::Instruction_*,_spv::Decoration> *)0x0;
  this = (_->ordered_instructions_).
         super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (_->ordered_instructions_).
           super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this == pIVar2) {
      local_278._0_8_ = &p_Stack_248;
      local_278._8_8_ = (pointer)0x1;
      local_278._16_8_ = (_Hash_node_base *)0x0;
      local_278._24_8_ = (pointer)0x0;
      local_278._32_4_ = 1.0;
      local_250 = (pointer)0x0;
      p_Stack_248 = (__node_base_ptr)0x0;
      sVar18 = SPV_SUCCESS;
      if (local_2b8 != iStack_2b0._M_current) {
        do {
          local_2a0 = iStack_2b0._M_current[-1].first;
          DVar5 = iStack_2b0._M_current[-1].second;
          iStack_2b0._M_current = iStack_2b0._M_current + -1;
          local_208._0_8_ = (Instruction *)local_278;
          pVar21 = std::
                   _Hashtable<spvtools::val::Instruction_const*,spvtools::val::Instruction_const*,std::allocator<spvtools::val::Instruction_const*>,std::__detail::_Identity,std::equal_to<spvtools::val::Instruction_const*>,std::hash<spvtools::val::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   ::
                   _M_insert<spvtools::val::Instruction_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::val::Instruction_const*,false>>>>
                             ((_Hashtable<spvtools::val::Instruction_const*,spvtools::val::Instruction_const*,std::allocator<spvtools::val::Instruction_const*>,std::__detail::_Identity,std::equal_to<spvtools::val::Instruction_const*>,std::hash<spvtools::val::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                               *)local_278,&local_2a0,
                              (pair<const_spvtools::val::Instruction_*,_spv::Decoration> *)
                              &local_208);
          if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            if (local_2a0->function_ == (Function *)0x0) {
              ppVar4 = (local_2a0->uses_).
                       super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (ppVar19 = (local_2a0->uses_).
                             super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; ppVar19 != ppVar4;
                  ppVar19 = ppVar19 + 1) {
                local_208._0_8_ = ppVar19->first;
                local_208._8_4_ = DVar5;
                if (iStack_2b0._M_current == local_2a8) {
                  std::
                  vector<std::pair<spvtools::val::Instruction_const*,spv::Decoration>,std::allocator<std::pair<spvtools::val::Instruction_const*,spv::Decoration>>>
                  ::_M_realloc_insert<std::pair<spvtools::val::Instruction_const*,spv::Decoration>>
                            ((vector<std::pair<spvtools::val::Instruction_const*,spv::Decoration>,std::allocator<std::pair<spvtools::val::Instruction_const*,spv::Decoration>>>
                              *)&local_2b8,iStack_2b0,
                             (pair<const_spvtools::val::Instruction_*,_spv::Decoration> *)&local_208
                            );
                }
                else {
                  (iStack_2b0._M_current)->first = (Instruction *)local_208._0_8_;
                  *(ulong *)&(iStack_2b0._M_current)->second = CONCAT44(local_208._12_4_,DVar5);
                  iStack_2b0._M_current = iStack_2b0._M_current + 1;
                }
              }
            }
            else {
              pvVar10 = ValidationState_t::FunctionEntryPoints(_,local_2a0->function_->id_);
              for (puVar17 = (pvVar10->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                  puVar17 !=
                  (pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_finish; puVar17 = puVar17 + 1) {
                uVar13 = (ulong)*puVar17 % (ulong)local_240._8_8_;
                if (*(BasicBlock **)(local_240._0_8_ + uVar13 * 8) != (BasicBlock *)0x0) {
                  plVar3 = *(long **)&(*(BasicBlock **)(local_240._0_8_ + uVar13 * 8))->id_;
                  uVar6 = *(uint *)(plVar3 + 1);
                  do {
                    if (*puVar17 == uVar6) {
                      pcVar16 = "FPFastMathMode Fast";
                      if (DVar5 == DecorationNoContraction) {
                        pcVar16 = "NoContraction";
                      }
                      pcVar14 = pcVar16 + 0x13;
                      if (DVar5 == DecorationNoContraction) {
                        pcVar14 = pcVar16 + 0xd;
                      }
                      local_298 = local_288;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_298,pcVar16,pcVar14);
                      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,local_2a0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,(char *)local_298,local_290);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,
                                 " cannot be used by an entry point with the FPFastMathDefault execution mode"
                                 ,0x4b);
                      DiagnosticStream::~DiagnosticStream(&local_208);
                      sVar18 = local_208.error_;
                      if (local_298 != local_288) {
                        operator_delete(local_298,local_288[0] + 1);
                      }
                      goto LAB_00685ad2;
                    }
                    plVar3 = (long *)*plVar3;
                  } while ((plVar3 != (long *)0x0) &&
                          (uVar6 = *(uint *)(plVar3 + 1),
                          (ulong)uVar6 % (ulong)local_240._8_8_ == uVar13));
                }
              }
            }
          }
        } while (local_2b8 != iStack_2b0._M_current);
        sVar18 = SPV_SUCCESS;
      }
LAB_00685ad2:
      std::
      _Hashtable<const_spvtools::val::Instruction_*,_const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::val::Instruction_*>,_std::hash<const_spvtools::val::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<const_spvtools::val::Instruction_*,_const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::val::Instruction_*>,_std::hash<const_spvtools::val::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_278);
      if (local_2b8 != (pair<const_spvtools::val::Instruction_*,_spv::Decoration> *)0x0) {
        operator_delete(local_2b8,(long)local_2a8 - (long)local_2b8);
      }
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_240);
      return sVar18;
    }
    if ((this->inst_).opcode == 0x47) {
      DVar5 = Instruction::GetOperandAs<spv::Decoration>(this,1);
      uVar6 = Instruction::GetOperandAs<unsigned_int>(this,0);
      pIVar9 = ValidationState_t::FindDef(_,uVar6);
      if (DVar5 == DecorationFPFastMathMode) {
        FVar7 = Instruction::GetOperandAs<spv::FPFastMathModeMask>(this,2);
        if ((FVar7 & Fast) != MaskNone) {
          local_208._8_4_ = DecorationFPFastMathMode;
          goto LAB_00685893;
        }
      }
      else if (DVar5 == DecorationNoContraction) {
        local_208._8_4_ = DecorationNoContraction;
LAB_00685893:
        local_208._0_8_ = pIVar9;
        if (iStack_2b0._M_current == local_2a8) {
          std::
          vector<std::pair<spvtools::val::Instruction_const*,spv::Decoration>,std::allocator<std::pair<spvtools::val::Instruction_const*,spv::Decoration>>>
          ::_M_realloc_insert<std::pair<spvtools::val::Instruction_const*,spv::Decoration>>
                    ((vector<std::pair<spvtools::val::Instruction_const*,spv::Decoration>,std::allocator<std::pair<spvtools::val::Instruction_const*,spv::Decoration>>>
                      *)&local_2b8,iStack_2b0,
                     (pair<const_spvtools::val::Instruction_*,_spv::Decoration> *)&local_208);
        }
        else {
          local_208._0_4_ = SUB84(pIVar9,0);
          local_208._4_4_ = SUB84((ulong)pIVar9 >> 0x20,0);
          *(undefined4 *)&(iStack_2b0._M_current)->first = local_208._0_4_;
          *(undefined4 *)((long)&(iStack_2b0._M_current)->first + 4) = local_208._4_4_;
          (iStack_2b0._M_current)->second = local_208._8_4_;
          *(undefined4 *)&(iStack_2b0._M_current)->field_0xc = local_208._12_4_;
          iStack_2b0._M_current = iStack_2b0._M_current + 1;
        }
      }
    }
    this = this + 1;
  } while( true );
}

Assistant:

spv_result_t ValidateFloatControls2(ValidationState_t& _) {
  std::unordered_set<uint32_t> fp_fast_math_default_entry_points;
  for (auto entry_point : _.entry_points()) {
    const auto* exec_modes = _.GetExecutionModes(entry_point);
    if (exec_modes &&
        exec_modes->count(spv::ExecutionMode::FPFastMathDefault)) {
      fp_fast_math_default_entry_points.insert(entry_point);
    }
  }

  std::vector<std::pair<const Instruction*, spv::Decoration>> worklist;
  for (const auto& inst : _.ordered_instructions()) {
    if (inst.opcode() != spv::Op::OpDecorate) {
      continue;
    }

    const auto decoration = inst.GetOperandAs<spv::Decoration>(1);
    const auto target_id = inst.GetOperandAs<uint32_t>(0);
    const auto target = _.FindDef(target_id);
    if (decoration == spv::Decoration::NoContraction) {
      worklist.push_back(std::make_pair(target, decoration));
    } else if (decoration == spv::Decoration::FPFastMathMode) {
      auto mask = inst.GetOperandAs<spv::FPFastMathModeMask>(2);
      if ((mask & spv::FPFastMathModeMask::Fast) !=
          spv::FPFastMathModeMask::MaskNone) {
        worklist.push_back(std::make_pair(target, decoration));
      }
    }
  }

  std::unordered_set<const Instruction*> visited;
  while (!worklist.empty()) {
    const auto inst = worklist.back().first;
    const auto decoration = worklist.back().second;
    worklist.pop_back();

    if (!visited.insert(inst).second) {
      continue;
    }

    const auto function = inst->function();
    if (function) {
      const auto& entry_points = _.FunctionEntryPoints(function->id());
      for (auto entry_point : entry_points) {
        if (fp_fast_math_default_entry_points.count(entry_point)) {
          const std::string dec = decoration == spv::Decoration::NoContraction
                                      ? "NoContraction"
                                      : "FPFastMathMode Fast";
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << dec
                 << " cannot be used by an entry point with the "
                    "FPFastMathDefault execution mode";
        }
      }
    } else {
      for (const auto& pair : inst->uses()) {
        worklist.push_back(std::make_pair(pair.first, decoration));
      }
    }
  }

  return SPV_SUCCESS;
}